

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineWriter.cpp
# Opt level: O0

void __thiscall adios2::core::engine::InlineWriter::EndStep(InlineWriter *this)

{
  int iVar1;
  ostream *poVar2;
  string *in_RDI;
  ScopedTimer __var2157;
  void *in_stack_fffffffffffffee8;
  ScopedTimer *in_stack_fffffffffffffef0;
  undefined8 in_stack_ffffffffffffff30;
  void *pvVar3;
  int commRank;
  string *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [39];
  allocator local_41;
  string local_40 [64];
  
  commRank = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  if (EndStep()::__var157 == '\0') {
    iVar1 = __cxa_guard_acquire(&EndStep()::__var157);
    if (iVar1 != 0) {
      EndStep::__var157 = (void *)ps_timer_create_("InlineWriter::EndStep");
      pvVar3 = EndStep::__var157;
      __cxa_guard_release(&EndStep()::__var157);
      commRank = (int)((ulong)pvVar3 >> 0x20);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  if ((in_RDI[6].field_2._M_local_buf[0] & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Engine",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"InlineWriter",&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"EndStep",&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff48,
               "InlineWriter::EndStep() cannot be called without a call to BeginStep() first",
               (allocator *)&stack0xffffffffffffff47);
    helper::Throw<std::runtime_error>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_RDI,
               commRank);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  if (*(int *)(in_RDI + 6) == 5) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Inline Writer ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)&in_RDI[6].field_0x4);
    poVar2 = std::operator<<(poVar2," EndStep() Step ");
    in_stack_fffffffffffffef0 =
         (ScopedTimer *)std::ostream::operator<<(poVar2,in_RDI[6]._M_string_length);
    std::ostream::operator<<(in_stack_fffffffffffffef0,std::endl<char,std::char_traits<char>>);
  }
  in_RDI[6].field_2._M_local_buf[0] = '\0';
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(in_stack_fffffffffffffef0);
  return;
}

Assistant:

void InlineWriter::EndStep()
{
    PERFSTUBS_SCOPED_TIMER("InlineWriter::EndStep");
    if (!m_InsideStep)
    {
        helper::Throw<std::runtime_error>("Engine", "InlineWriter", "EndStep",
                                          "InlineWriter::EndStep() cannot be called "
                                          "without a call to BeginStep() first");
    }
    if (m_Verbosity == 5)
    {
        std::cout << "Inline Writer " << m_WriterRank << " EndStep() Step " << m_CurrentStep
                  << std::endl;
    }
    m_InsideStep = false;
}